

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void opengv::relative_pose::modules::ge_main2
               (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
               Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P,
               Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
               Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
               Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
               Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *startingPoint,geOutput_t *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ActualDstType actualDst;
  long lVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  double currentValue;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  double dVar19;
  Vector4d D;
  Matrix<std::complex<double>,_4,_4,_0,_4,_4> V_complex;
  Matrix4d V;
  Matrix<std::complex<double>,_4,_1,_0,_4,_1> D_complex;
  Matrix4d G;
  EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> Eig;
  uint local_814;
  cayley_t local_810;
  double local_7f8;
  double local_7f0;
  double dStack_7e8;
  Matrix3d *local_7e0;
  double local_7d8;
  Matrix3d *local_7d0;
  int local_7c4;
  double local_7c0;
  double dStack_7b8;
  double local_7b0;
  undefined8 uStack_7a8;
  double local_7a0 [4];
  undefined1 local_780 [16];
  double local_770;
  double local_680;
  double dStack_678;
  double dStack_670;
  double dStack_668;
  double dStack_660;
  double dStack_658;
  double dStack_650;
  double dStack_648;
  double local_640;
  double dStack_638;
  double dStack_630;
  double dStack_628;
  double dStack_620;
  double dStack_618;
  double dStack_610;
  double dStack_608;
  double local_600 [8];
  Matrix4d local_5c0;
  double local_520;
  double dStack_518;
  double *pdStack_510;
  double dStack_508;
  double dStack_500;
  double dStack_4f8;
  double dStack_4f0;
  double dStack_4e8;
  double local_4e0;
  undefined1 local_4c0 [128];
  double local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined2 local_400;
  bool local_1c0;
  undefined2 local_17c;
  Index local_178;
  
  local_814 = 0;
  local_7b0 = 0.3;
  local_7e0 = yyF;
  local_7d0 = xxF;
  do {
    local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (startingPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[0];
    local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (startingPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[1];
    local_7b0 = (double)((ulong)(2 < local_814) * 0x3fe3333333333333 +
                        (ulong)(2 >= local_814) * (long)local_7b0);
    local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = (startingPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[2];
    uStack_7a8 = 0;
    if (local_814 != 0) {
      iVar4 = rand();
      local_7f0 = (double)CONCAT44(local_7f0._4_4_,iVar4);
      iVar4 = rand();
      auVar8 = vpinsrd_avx(ZEXT416(local_7f0._0_4_),iVar4,1);
      auVar8 = vcvtdq2pd_avx(auVar8);
      auVar7._8_8_ = 0x41dfffffffc00000;
      auVar7._0_8_ = 0x41dfffffffc00000;
      auVar7 = vdivpd_avx512vl(auVar8,auVar7);
      auVar8._8_8_ = 0xbfe0000000000000;
      auVar8._0_8_ = 0xbfe0000000000000;
      auVar8 = vaddpd_avx512vl(auVar7,auVar8);
      local_7f0 = local_7b0 * (auVar8._0_8_ + auVar8._0_8_);
      dStack_7e8 = local_7b0 * (auVar8._8_8_ + auVar8._8_8_);
      iVar4 = rand();
      local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_7f0 +
            local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0];
      local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = dStack_7e8 +
            local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1];
      dVar12 = (double)iVar4 / 2147483647.0 + -0.5;
      local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (dVar12 + dVar12) * local_7b0 +
            local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2];
    }
    currentValue = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                               &local_810,1);
    iVar4 = 0;
    dVar12 = 0.01;
    dVar19 = 0.0;
    do {
      if (iVar4 == 0x32) break;
      local_7f8 = currentValue;
      local_7f0 = dVar12;
      dStack_7e8 = dVar19;
      ge::getQuickJacobian
                (xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,&local_810,
                 currentValue,(Matrix<double,_1,_3,_1,_1,_3> *)local_4c0,1);
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           (double)local_4c0._0_8_ * (double)local_4c0._0_8_ +
           (double)local_4c0._8_8_ * (double)local_4c0._8_8_ +
           (double)local_4c0._16_8_ * (double)local_4c0._16_8_;
      auVar8 = vsqrtsd_avx(auVar14,auVar14);
      dStack_7b8 = 1.0 / auVar8._0_8_;
      local_7d8 = (double)local_4c0._16_8_ * dStack_7b8;
      local_7c0 = (double)local_4c0._0_8_ * dStack_7b8;
      dStack_7b8 = (double)local_4c0._8_8_ * dStack_7b8;
      auVar1._8_8_ = local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
      auVar1._0_8_ = local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
      auVar15._0_8_ = local_7f0 * local_7c0;
      auVar15._8_8_ = local_7f0 * dStack_7b8;
      local_780 = vsubpd_avx(auVar1,auVar15);
      local_770 = local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2] - local_7f0 * local_7d8;
      currentValue = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                                 (cayley_t *)local_780,1);
      xxF = local_7d0;
      yyF = local_7e0;
      local_7c4 = iVar4;
      if ((iVar4 == 0) && (currentValue < local_7f8)) {
        do {
          dVar12 = local_7f0 + local_7f0;
          if (0.08 < dVar12) goto LAB_001739f6;
          auVar2._8_8_ = local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[1];
          auVar2._0_8_ = local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0];
          auVar16._0_8_ = local_7c0 * dVar12;
          auVar16._8_8_ = dStack_7b8 * dVar12;
          local_780 = vsubpd_avx(auVar2,auVar16);
          local_770 = local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] - local_7d8 * dVar12;
          dStack_7e8 = 0.0;
          local_7f8 = currentValue;
          local_7f0 = dVar12;
          currentValue = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                                     (cayley_t *)local_780,1);
        } while (currentValue < local_7f8);
      }
      if (local_7f8 < currentValue) {
        do {
          local_7f0 = local_7f0 * 0.5;
          auVar3._8_8_ = local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[1];
          auVar3._0_8_ = local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0];
          dStack_7e8 = 0.0;
          auVar17._0_8_ = local_7c0 * local_7f0;
          auVar17._8_8_ = dStack_7b8 * local_7f0;
          local_780 = vsubpd_avx(auVar3,auVar17);
          local_770 = local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] - local_7d8 * local_7f0;
          currentValue = ge::getCost(xxF,local_7e0,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P
                                     ,m22P,(cayley_t *)local_780,1);
          yyF = local_7e0;
        } while (local_7f8 < currentValue);
      }
LAB_001739f6:
      local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)local_780._0_8_;
      local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (double)local_780._8_8_;
      local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_770;
      iVar4 = local_7c4 + 1;
      dVar12 = local_7f0;
      dVar19 = dStack_7e8;
    } while (1e-05 <= local_7f0);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] *
         local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] +
         local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] *
         local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] +
         local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1] *
         local_810.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    auVar8 = vsqrtsd_avx(auVar13,auVar13);
    if (0.01 <= auVar8._0_8_) {
LAB_00173ad6:
      ge::composeG(&local_5c0,xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                   &local_810);
      lVar5 = 0;
      local_1c0 = false;
      local_17c._0_1_ = false;
      local_17c._1_1_ = false;
      local_440 = 0.0;
      uStack_438 = 0;
      uStack_430 = 0;
      uStack_428 = 0;
      uStack_420 = 0;
      uStack_418 = 0;
      uStack_410 = 0;
      uStack_408 = 0;
      local_400._0_1_ = false;
      local_400._1_1_ = false;
      local_178 = -1;
      Eigen::EigenSolver<Eigen::Matrix<double,4,4,0,4,4>>::compute<Eigen::Matrix<double,4,4,0,4,4>>
                ((EigenSolver<Eigen::Matrix<double,4,4,0,4,4>> *)local_4c0,
                 (EigenBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_5c0,true);
      pdVar6 = local_600;
      local_600[0] = local_440;
      local_600[1] = (double)uStack_438;
      local_600[2] = (double)uStack_430;
      local_600[3] = (double)uStack_428;
      local_600[4] = (double)uStack_420;
      local_600[5] = (double)uStack_418;
      local_600[6] = (double)uStack_410;
      local_600[7] = (double)uStack_408;
      Eigen::EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::eigenvectors
                ((EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_4c0);
      pdStack_510 = &local_680;
      auVar9 = vpbroadcastq_avx512vl();
      auVar9 = vpaddq_avx2(auVar9,_DAT_0025f3e0);
      auVar10 = vpbroadcastq_avx512vl();
      auVar10 = vpaddq_avx2(auVar10,_DAT_0025f400);
      do {
        dVar12 = *pdVar6;
        pdVar6 = pdVar6 + 2;
        local_7a0[lVar5] = dVar12;
        auVar11 = vpbroadcastq_avx512vl();
        lVar5 = lVar5 + 1;
        auVar18 = vpsllq_avx2(auVar11,4);
        auVar11 = vpsllq_avx2(auVar11,3);
        vpaddq_avx2(auVar9,auVar18);
        auVar11 = vpaddq_avx2(auVar10,auVar11);
        auVar18 = vgatherqpd_avx512vl(local_4c0._0_8_);
        vscatterqpd_avx512vl(ZEXT832(0) + auVar11,0xffff,auVar18);
      } while (lVar5 != 4);
      local_520 = 1.0 / dStack_668;
      (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = local_520 * local_680;
      (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = local_520 * dStack_678;
      (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = local_520 * dStack_670;
      (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = local_520 * dStack_668;
      math::cayley2rot(&local_810);
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[8] = local_4e0;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[0] = local_520;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[1] = dStack_518;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[2] = (double)pdStack_510;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[3] = dStack_508;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[4] = dStack_500;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[5] = dStack_4f8;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[6] = dStack_4f0;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[7] = dStack_4e8;
      (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = local_7a0[0];
      (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = local_7a0[1];
      (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = local_7a0[2];
      (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = local_7a0[3];
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0] = local_680;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[1] = dStack_678;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[2] = dStack_670;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[3] = dStack_668;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[4] = dStack_660;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[5] = dStack_658;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[6] = dStack_650;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[7] = dStack_648;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[8] = local_640;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[9] = dStack_638;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[10] = dStack_630;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0xb] = dStack_628;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0xc] = dStack_620;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0xd] = dStack_618;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0xe] = dStack_610;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0xf] = dStack_608;
      return;
    }
    dVar12 = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,&local_810,0
                        );
    if ((dVar12 <= 0.001) || (local_814 = local_814 + (0.001 < dVar12), 4 < local_814))
    goto LAB_00173ad6;
  } while( true );
}

Assistant:

void
opengv::relative_pose::modules::ge_main2(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & startingPoint,
    geOutput_t & output )
{
  //todo: the optimization strategy is something that can possibly be improved:
  //-one idea is to check the gradient at the new sampling point, if that derives
  // too much, we have to stop
  //-another idea consists of having linear change of lambda, instead of exponential (safer, but slower)
  
  double lambda = 0.01;
  double maxLambda = 0.08;
  double modifier = 2.0;
  int maxIterations = 50;
  double min_xtol = 0.00001;
  bool disablingIncrements = true;
  bool print = false;

  cayley_t cayley;
  
  double disturbanceAmplitude = 0.3;
  bool found = false;
  int randomTrialCount = 0;
  
  while( !found && randomTrialCount < 5 )
  {
    if(randomTrialCount > 2)
      disturbanceAmplitude = 0.6;
	
    if( randomTrialCount == 0 )
      cayley = startingPoint;
    else
    {
      cayley = startingPoint;
      Eigen::Vector3d disturbance;
      disturbance[0] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*disturbanceAmplitude;
      disturbance[1] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*disturbanceAmplitude;
      disturbance[2] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*disturbanceAmplitude;
      cayley += disturbance;
    }
	
    lambda = 0.01;
    int iterations = 0;
    double smallestEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
        x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,1);
    
    while( iterations < maxIterations )
    {
      Eigen::Matrix<double,1,3> jacobian;
      ge::getQuickJacobian(xxF,yyF,zzF,xyF,yzF,zxF,
          x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,smallestEV,jacobian,1);
      
      double norm = sqrt(pow(jacobian[0],2.0) + pow(jacobian[1],2.0) + pow(jacobian[2],2.0));
      cayley_t normalizedJacobian = (1/norm) * jacobian.transpose();
      
      cayley_t samplingPoint = cayley - lambda * normalizedJacobian;
      double samplingEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
          x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,samplingPoint,1);
      
      if(print)
      {
        std::cout << iterations << ": " << samplingPoint.transpose();
        std::cout << " lambda: " << lambda << " EV: " << samplingEV << std::endl;
      }
      
      if( iterations == 0 || !disablingIncrements )
      {
        while( samplingEV < smallestEV )
        {
          smallestEV = samplingEV;
          if( lambda * modifier > maxLambda )
            break;
          lambda *= modifier;
          samplingPoint = cayley - lambda * normalizedJacobian;
          samplingEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
              x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,samplingPoint,1);
          
          if(print)
          {
            std::cout << iterations << ": " << samplingPoint.transpose();
            std::cout << " lambda: " << lambda << " EV: " << samplingEV << std::endl;
          }
        }
      }
      
      while( samplingEV > smallestEV )
      {
        lambda /= modifier;
        samplingPoint = cayley - lambda * normalizedJacobian;
        samplingEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
            x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,samplingPoint,1);
        
        if(print)
        {
          std::cout << iterations << ": " << samplingPoint.transpose();
          std::cout << " lambda: " << lambda << " EV: " << samplingEV << std::endl;
        }
      }
      
      //apply update
      cayley = samplingPoint;
      smallestEV = samplingEV;
      
      //stopping condition (check if the update was too small)
      if( lambda < min_xtol )
        break;
      
      iterations++;
    }
    
    //try to see if we can robustly identify each time we enter up in the wrong minimum
    if( cayley.norm() < 0.01 )
    {
      //we are close to the origin, test the EV 2
      double ev2 = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
            x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,0);
      if( ev2 > 0.001 )
        randomTrialCount++;
      else
        found = true;
    }
    else
      found = true;
  }
  
  Eigen::Matrix4d G = ge::composeG(xxF,yyF,zzF,xyF,yzF,zxF,
      x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley);
  
  Eigen::EigenSolver< Eigen::Matrix4d > Eig(G,true);
  Eigen::Matrix<std::complex<double>,4,1> D_complex = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,4,4> V_complex = Eig.eigenvectors();
  Eigen::Vector4d D;
  Eigen::Matrix4d V;
  for(size_t i = 0; i < 4; i++)
  {
    D[i] = D_complex[i].real();
    for(size_t j = 0; j < 4; j++)
      V(i,j) = V_complex(i,j).real();
  }

  double factor = V(3,0);
  Eigen::Vector4d t = (1.0/factor) * V.col(0);

  output.translation = t;
  output.rotation = math::cayley2rot(cayley);
  output.eigenvalues = D;
  output.eigenvectors = V;
}